

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

void HTS_lsp2mgc(HTS_Vocoder *v,double *lsp,double *mgc,int m,double alpha)

{
  undefined8 uVar1;
  int iVar2;
  int in_ECX;
  double *in_RDX;
  double *in_RSI;
  double in_RDI;
  double *in_XMM0_Qa;
  double dVar3;
  undefined1 auVar4 [16];
  int unaff_retaddr;
  double *in_stack_00000008;
  int i;
  double *in_stack_00000038;
  HTS_Vocoder *in_stack_00000040;
  double in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  
  HTS_lsp2lpc(in_stack_00000040,in_stack_00000038,(double *)v,lsp._4_4_);
  if (*(char *)((long)in_RDI + 0x18) == '\0') {
    *in_RDX = *in_RSI;
  }
  else {
    dVar3 = exp(*in_RSI);
    *in_RDX = dVar3;
  }
  HTS_ignorm((double *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_XMM0_Qa,
             in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  for (iVar2 = in_ECX; 0 < iVar2; iVar2 = iVar2 + -1) {
    uVar1 = *(undefined8 *)((long)in_RDI + 8);
    auVar4._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar4._0_8_ = uVar1;
    auVar4._12_4_ = 0x45300000;
    in_RDX[iVar2] =
         -((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * in_RDX[iVar2];
  }
  HTS_mgc2mgc((HTS_Vocoder *)alpha,in_stack_00000008,unaff_retaddr,in_RDI,(double)in_RSI,in_RDX,
              in_ECX,(double)in_XMM0_Qa,(double)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
  return;
}

Assistant:

static void HTS_lsp2mgc(HTS_Vocoder * v, double *lsp, double *mgc, const int m, const double alpha)
{
   int i;
   /* lsp2lpc */
   HTS_lsp2lpc(v, lsp + 1, mgc, m);
   if (v->use_log_gain)
      mgc[0] = exp(lsp[0]);
   else
      mgc[0] = lsp[0];

   /* mgc2mgc */
   if (NORMFLG1)
      HTS_ignorm(mgc, mgc, m, v->gamma);
   else if (MULGFLG1)
      mgc[0] = (1.0 - mgc[0]) * ((double) v->stage);
   if (MULGFLG1)
      for (i = m; i >= 1; i--)
         mgc[i] *= -((double) v->stage);
   HTS_mgc2mgc(v, mgc, m, alpha, v->gamma, mgc, m, alpha, v->gamma);
   if (NORMFLG2)
      HTS_gnorm(mgc, mgc, m, v->gamma);
   else if (MULGFLG2)
      mgc[0] = mgc[0] * v->gamma + 1.0;
   if (MULGFLG2)
      for (i = m; i >= 1; i--)
         mgc[i] *= v->gamma;
}